

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

EVdfg_stone INT_EVdfg_create_source_stone(EVdfg dfg,char *source_name)

{
  size_t sVar1;
  char *__dest;
  EVdfg_stone p_Var2;
  char *in_RSI;
  char *act;
  size_t len;
  EVdfg_stone tmp;
  char *in_stack_00000028;
  EVdfg in_stack_00000030;
  
  sVar1 = strlen(in_RSI);
  __dest = (char *)INT_CMmalloc(sVar1 + 7);
  strcpy(__dest,"source:");
  strcat(__dest,in_RSI);
  p_Var2 = INT_EVdfg_create_stone(in_stack_00000030,in_stack_00000028);
  free(__dest);
  return p_Var2;
}

Assistant:

EVdfg_stone
INT_EVdfg_create_source_stone(EVdfg dfg, char *source_name)
{
    EVdfg_stone tmp;
    size_t len = strlen(source_name) + strlen("source:");
    char *act = malloc(len + 1);
    strcpy(&act[0], "source:");
    strcat(&act[0], source_name);
    tmp = INT_EVdfg_create_stone(dfg, &act[0]);
    free(act);
    return tmp;
}